

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_conn.cc
# Opt level: O2

void __thiscall iqxmlrpc::Client_connection::Client_connection(Client_connection *this)

{
  ulong in_RAX;
  undefined8 uStack_18;
  
  this->_vptr_Client_connection = (_func_int **)&PTR__Client_connection_0019bf40;
  uStack_18 = in_RAX;
  http::Packet_reader::Packet_reader(&this->preader);
  uStack_18 = uStack_18 & 0xffffffffffffff;
  std::vector<char,_std::allocator<char>_>::vector
            (&this->read_buf_,0x10000,(value_type *)((long)&uStack_18 + 7),
             (allocator_type *)((long)&uStack_18 + 6));
  return;
}

Assistant:

Client_connection::Client_connection():
  read_buf_(65536, '\0')
{
}